

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

size_t __thiscall
google::protobuf::UninterpretedOption_NamePart::ByteSizeLong(UninterpretedOption_NamePart *this)

{
  size_t sVar1;
  
  if ((~(this->_has_bits_).has_bits_[0] & 3) == 0) {
    sVar1 = internal::WireFormatLite::StringSize
                      ((string *)((ulong)(this->name_part_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    sVar1 = sVar1 + 3;
  }
  else {
    sVar1 = RequiredFieldsByteSizeFallback(this);
  }
  sVar1 = Message::MaybeComputeUnknownFieldsSize(&this->super_Message,sVar1,&this->_cached_size_);
  return sVar1;
}

Assistant:

size_t UninterpretedOption_NamePart::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.UninterpretedOption.NamePart)
  size_t total_size = 0;

  if (((_has_bits_[0] & 0x00000003) ^ 0x00000003) == 0) {  // All required fields are present.
    // required string name_part = 1;
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_name_part());

    // required bool is_extension = 2;
    total_size += 1 + 1;

  } else {
    total_size += RequiredFieldsByteSizeFallback();
  }
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  return MaybeComputeUnknownFieldsSize(total_size, &_cached_size_);
}